

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  char *pcVar1;
  char cVar2;
  ImGuiContext *pIVar3;
  char *__dest;
  long lVar4;
  char *pcVar5;
  undefined1 *puVar6;
  void *pvVar7;
  ImGuiSettingsHandler *pIVar8;
  void *pvVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  ImGuiSettingsHandler *handler;
  char *pcVar14;
  
  pIVar3 = GImGui;
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  iVar12 = (int)ini_size + 1;
  iVar13 = (pIVar3->SettingsIniData).Buf.Capacity;
  if ((int)ini_size < iVar13) {
    __dest = (pIVar3->SettingsIniData).Buf.Data;
  }
  else {
    if (iVar13 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar13 / 2 + iVar13;
    }
    if (iVar13 <= iVar12) {
      iVar13 = iVar12;
    }
    __dest = (char *)MemAlloc((long)iVar13);
    pcVar1 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar1 != (char *)0x0) {
      memcpy(__dest,pcVar1,(long)(pIVar3->SettingsIniData).Buf.Size);
      MemFree((pIVar3->SettingsIniData).Buf.Data);
    }
    (pIVar3->SettingsIniData).Buf.Data = __dest;
    (pIVar3->SettingsIniData).Buf.Capacity = iVar13;
  }
  (pIVar3->SettingsIniData).Buf.Size = iVar12;
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  lVar4 = (long)(pIVar3->SettingsHandlers).Size;
  if (lVar4 != 0) {
    pIVar8 = (pIVar3->SettingsHandlers).Data;
    lVar4 = lVar4 * 0x48;
    do {
      if (pIVar8->ReadInitFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        (*pIVar8->ReadInitFn)(pIVar3,pIVar8);
      }
      pIVar8 = pIVar8 + 1;
      lVar4 = lVar4 + -0x48;
    } while (lVar4 != 0);
  }
  if (0 < (long)ini_size) {
    pcVar1 = __dest + ini_size;
    pvVar9 = (void *)0x0;
    pIVar8 = (ImGuiSettingsHandler *)0x0;
    pcVar14 = __dest;
    do {
      pcVar5 = pcVar14 + 2;
      pcVar10 = pcVar14;
      while( true ) {
        pcVar10 = pcVar10 + 1;
        cVar2 = *pcVar14;
        if ((cVar2 != '\n') && (cVar2 != '\r')) break;
        pcVar14 = pcVar14 + 1;
        pcVar5 = pcVar5 + 1;
      }
      pcVar11 = pcVar14;
      if (pcVar14 < pcVar1) {
        while ((cVar2 != '\n' && (cVar2 != '\r'))) {
          pcVar11 = pcVar10;
          if (pcVar1 <= pcVar10) goto LAB_001905ce;
          cVar2 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        }
        pcVar11 = pcVar10 + -1;
      }
LAB_001905ce:
      *pcVar11 = '\0';
      if (*pcVar14 != ';') {
        if (((*pcVar14 == '[') && (pcVar14 < pcVar11)) && (pcVar11[-1] == ']')) {
          pcVar11[-1] = '\0';
          puVar6 = (undefined1 *)memchr(pcVar14 + 1,0x5d,(long)pcVar11 - (long)pcVar5);
          if ((puVar6 != (undefined1 *)0x0) &&
             (pvVar7 = memchr(puVar6 + 1,0x5b,(size_t)(pcVar11 + (-1 - (long)(puVar6 + 1)))),
             pvVar7 != (void *)0x0)) {
            *puVar6 = 0;
            pIVar8 = FindSettingsHandler(pcVar14 + 1);
            if (pIVar8 == (ImGuiSettingsHandler *)0x0) {
              pIVar8 = (ImGuiSettingsHandler *)0x0;
              pvVar9 = (void *)0x0;
            }
            else {
              pvVar9 = (*pIVar8->ReadOpenFn)(pIVar3,pIVar8,(char *)((long)pvVar7 + 1));
            }
          }
        }
        else if ((pIVar8 != (ImGuiSettingsHandler *)0x0) && (pvVar9 != (void *)0x0)) {
          (*pIVar8->ReadLineFn)(pIVar3,pIVar8,pvVar9,pcVar14);
        }
      }
      pcVar14 = pcVar11 + 1;
    } while (pcVar14 < pcVar1);
  }
  pIVar3->SettingsLoaded = true;
  memcpy(__dest,ini_data,ini_size);
  lVar4 = (long)(pIVar3->SettingsHandlers).Size;
  if (lVar4 != 0) {
    pIVar8 = (pIVar3->SettingsHandlers).Data;
    lVar4 = lVar4 * 0x48;
    do {
      if (pIVar8->ApplyAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        (*pIVar8->ApplyAllFn)(pIVar3,pIVar8);
      }
      pIVar8 = pIVar8 + 1;
      lVar4 = lVar4 + -0x48;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ReadInitFn != NULL)
            handler.ReadInitFn(&g, &handler);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ApplyAllFn != NULL)
            handler.ApplyAllFn(&g, &handler);
}